

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interp.cc
# Opt level: O3

Result ReadAndInstantiateModule(char *module_filename,Errors *errors,Ptr *out_instance)

{
  ExternType *pEVar1;
  unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_> *puVar2;
  Ptr *pPVar3;
  Result RVar4;
  int iVar5;
  char *pcVar6;
  pointer __dest;
  Ref *pRVar7;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RCX;
  ulong uVar8;
  pointer pIVar9;
  Enum EVar10;
  size_t __n;
  string *psVar11;
  bool bVar12;
  string_view filename;
  RefVec imports;
  FuncType func_type;
  vector<unsigned_char,_std::allocator<unsigned_char>_> file_data;
  string import_name;
  ModuleDesc module_desc;
  ReadBinaryOptions options;
  RefVec local_438;
  tuple<wabt::FileStream_*,_std::default_delete<wabt::FileStream>_> local_418;
  Ptr *local_410;
  undefined1 local_408 [8];
  Store *pSStack_400;
  Index local_3f8;
  undefined1 local_3f0 [88];
  RefPtr<wabt::interp::HostFunc> local_398;
  RefPtr<wabt::interp::Module> local_380;
  _Any_data local_368;
  code *local_358;
  code *local_350;
  undefined1 local_348 [40];
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_320;
  void *local_308;
  long lStack_300;
  undefined8 local_2f8;
  string local_2f0;
  FuncType local_2d0;
  ModuleDesc local_290;
  ModuleDesc local_170;
  ReadBinaryOptions local_50;
  
  local_418.super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
  super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>)
       (_Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>)
       s_stdout_stream._M_t.
       super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>._M_t.
       super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
       super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl;
  local_308 = (void *)0x0;
  lStack_300 = 0;
  local_2f8 = 0;
  pcVar6 = (char *)strlen(module_filename);
  filename.size_ = (size_type)&local_308;
  filename.data_ = pcVar6;
  RVar4 = wabt::ReadFile((wabt *)module_filename,filename,in_RCX);
  EVar10 = Error;
  if (RVar4.enum_ != Error) {
    memset(&local_290,0,0x120);
    local_50.features.exceptions_enabled_ = s_features.exceptions_enabled_;
    local_50.features.mutable_globals_enabled_ = s_features.mutable_globals_enabled_;
    local_50.features.sat_float_to_int_enabled_ = s_features.sat_float_to_int_enabled_;
    local_50.features.sign_extension_enabled_ = s_features.sign_extension_enabled_;
    local_50.features.simd_enabled_ = s_features.simd_enabled_;
    local_50.features.threads_enabled_ = s_features.threads_enabled_;
    local_50.features.multi_value_enabled_ = s_features.multi_value_enabled_;
    local_50.features.tail_call_enabled_ = s_features.tail_call_enabled_;
    local_50.features.bulk_memory_enabled_ = s_features.bulk_memory_enabled_;
    local_50.features.reference_types_enabled_ = s_features.reference_types_enabled_;
    local_50.features.annotations_enabled_ = s_features.annotations_enabled_;
    local_50.features.gc_enabled_ = s_features.gc_enabled_;
    local_50.log_stream =
         (Stream *)
         s_log_stream._M_t.
         super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>._M_t.
         super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
         super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl;
    local_50.read_debug_names = true;
    local_50.stop_on_first_error = true;
    local_50.fail_on_custom_section_error = true;
    RVar4 = wabt::interp::ReadBinaryInterp
                      (local_308,lStack_300 - (long)local_308,&local_50,errors,&local_290);
    EVar10 = Error;
    if (RVar4.enum_ != Error) {
      if (s_verbose != 0) {
        wabt::interp::Istream::Disassemble
                  (&local_290.istream,
                   (Stream *)
                   local_418.
                   super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>
                   .super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl);
      }
      std::vector<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>::vector
                (&local_170.func_types,&local_290.func_types);
      std::vector<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>::vector
                (&local_170.imports,&local_290.imports);
      std::vector<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>::vector
                (&local_170.funcs,&local_290.funcs);
      std::vector<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>::vector
                (&local_170.tables,&local_290.tables);
      std::vector<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>::vector
                (&local_170.memories,&local_290.memories);
      std::vector<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>::vector
                (&local_170.globals,&local_290.globals);
      std::vector<wabt::interp::EventDesc,_std::allocator<wabt::interp::EventDesc>_>::vector
                (&local_170.events,&local_290.events);
      std::vector<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>::vector
                (&local_170.exports,&local_290.exports);
      std::vector<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>::vector
                (&local_170.starts,&local_290.starts);
      std::vector<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>::vector
                (&local_170.elems,&local_290.elems);
      std::vector<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>::vector
                (&local_170.datas,&local_290.datas);
      local_170.istream.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_170.istream.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_170.istream.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      uVar8 = (long)local_290.istream.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_290.istream.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
      if (uVar8 == 0) {
        __dest = (pointer)0x0;
        __n = 0;
      }
      else {
        if ((long)uVar8 < 0) {
          std::__throw_bad_alloc();
        }
        __dest = (pointer)operator_new(uVar8);
        __n = (long)local_290.istream.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_290.istream.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
      }
      local_170.istream.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = __dest + uVar8;
      local_410 = out_instance;
      local_170.istream.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = __dest;
      if (local_290.istream.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_290.istream.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        local_170.istream.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish = __dest;
        memmove(__dest,local_290.istream.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start,__n);
      }
      local_170.istream.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = __dest + __n;
      wabt::interp::Store::Alloc<wabt::interp::Module,wabt::interp::Store&,wabt::interp::ModuleDesc>
                (&local_380,&s_store,&s_store,&local_170);
      wabt::interp::ModuleDesc::~ModuleDesc(&local_170);
      local_438.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_438.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
      super__Vector_impl_data._M_finish = (Ref *)0x0;
      local_438.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (Ref *)0x0;
      if (local_290.imports.
          super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          local_290.imports.
          super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        local_3f0._80_8_ =
             local_290.imports.
             super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        pIVar9 = local_290.imports.
                 super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        psVar11 = &((local_290.imports.
                     super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>
                     ._M_impl.super__Vector_impl_data._M_start)->type).name;
        do {
          if (((((unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
                  *)(psVar11 + 1))->_M_t).
               super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
               ._M_t.
               super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
               .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl)->kind ==
              First) {
            if (s_host_print == '\x01') {
              iVar5 = std::__cxx11::string::compare((char *)(psVar11 + -1));
              if (iVar5 != 0) goto LAB_00141438;
              iVar5 = std::__cxx11::string::compare((char *)psVar11);
              if (iVar5 != 0) goto LAB_00141438;
            }
            else {
LAB_00141438:
              if (s_dummy_import_func != '\x01') goto LAB_00141598;
            }
            pEVar1 = (((unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
                        *)(psVar11 + 1))->_M_t).
                     super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
                     .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl;
            if (pEVar1->kind != First) {
              __assert_fail("isa<Derived>(base)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/cast.h"
                            ,0x4e,
                            "Derived *wabt::cast(Base *) [Derived = wabt::interp::FuncType, Base = wabt::interp::ExternType]"
                           );
            }
            local_348._8_4_ = First;
            local_348._0_8_ = &PTR__FuncType_001a01d0;
            std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
                      ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)(local_348 + 0x10),
                       (vector<wabt::Type,_std::allocator<wabt::Type>_> *)(pEVar1 + 1));
            std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
                      (&local_320,(vector<wabt::Type,_std::allocator<wabt::Type>_> *)&pEVar1[2].kind
                      );
            wabt::StringPrintf_abi_cxx11_
                      (&local_2f0,"%s.%s",(((ImportType *)(psVar11 + -1))->module)._M_dataplus._M_p,
                       (psVar11->_M_dataplus)._M_p);
            local_2d0.super_ExternType.kind = local_348._8_4_;
            local_2d0.super_ExternType._vptr_ExternType = (_func_int **)&PTR__FuncType_001a01d0;
            std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
                      (&local_2d0.params,
                       (vector<wabt::Type,_std::allocator<wabt::Type>_> *)(local_348 + 0x10));
            std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
                      (&local_2d0.results,&local_320);
            local_408 = (undefined1  [8])
                        local_418.
                        super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>
                        .super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl;
            pSStack_400 = (Store *)local_3f0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&pSStack_400,local_2f0._M_dataplus._M_p,
                       local_2f0._M_dataplus._M_p + local_2f0._M_string_length);
            local_3f0._24_4_ = local_348._8_4_;
            local_3f0._16_8_ = &PTR__FuncType_001a01d0;
            std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
                      ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)(local_3f0 + 0x20),
                       (vector<wabt::Type,_std::allocator<wabt::Type>_> *)(local_348 + 0x10));
            std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
                      ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)(local_3f0 + 0x38),
                       &local_320);
            local_368._8_8_ = (pointer)0x0;
            local_368._M_unused._M_object = operator_new(0x68);
            *(undefined1 (*) [8])local_368._M_unused._0_8_ = local_408;
            *(code **)((long)local_368._M_unused._0_8_ + 8) =
                 (code *)((long)local_368._M_unused._0_8_ + 0x18);
            if (pSStack_400 == (Store *)local_3f0) {
              *(unsigned_long *)((long)local_368._M_unused._0_8_ + 0x18) =
                   CONCAT71(local_3f0._1_7_,local_3f0[0]);
              *(undefined8 *)((long)local_368._M_unused._0_8_ + 0x20) = local_3f0._8_8_;
            }
            else {
              *(Store **)((long)local_368._M_unused._0_8_ + 8) = pSStack_400;
              *(unsigned_long *)((long)local_368._M_unused._0_8_ + 0x18) =
                   CONCAT71(local_3f0._1_7_,local_3f0[0]);
            }
            *(Index *)((long)local_368._M_unused._0_8_ + 0x10) = local_3f8;
            pSStack_400 = (Store *)local_3f0;
            local_3f8 = 0;
            local_3f0[0] = false;
            *(undefined4 *)((long)local_368._M_unused._0_8_ + 0x30) = local_3f0._24_4_;
            *(undefined ***)((long)local_368._M_unused._0_8_ + 0x28) = &PTR__FuncType_001a01d0;
            *(undefined8 *)((long)local_368._M_unused._0_8_ + 0x38) = local_3f0._32_8_;
            *(undefined8 *)((long)local_368._M_unused._0_8_ + 0x40) = local_3f0._40_8_;
            *(undefined8 *)((long)local_368._M_unused._0_8_ + 0x48) = local_3f0._48_8_;
            local_3f0._48_8_ = (pointer)0x0;
            local_3f0._32_8_ = (pointer)0x0;
            local_3f0._40_8_ = (pointer)0x0;
            *(undefined8 *)((long)local_368._M_unused._0_8_ + 0x50) = local_3f0._56_8_;
            *(undefined8 *)((long)local_368._M_unused._0_8_ + 0x58) = local_3f0._64_8_;
            *(undefined8 *)((long)local_368._M_unused._0_8_ + 0x60) = local_3f0._72_8_;
            local_3f0._72_8_ = 0;
            local_3f0._56_8_ = (pointer)0x0;
            local_3f0._64_8_ = (_Bit_type *)0x0;
            local_350 = std::
                        _Function_handler<wabt::Result_(const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wasm-interp.cc:174:25)>
                        ::_M_invoke;
            local_358 = std::
                        _Function_handler<wabt::Result_(const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/wasm-interp.cc:174:25)>
                        ::_M_manager;
            wabt::interp::Store::
            Alloc<wabt::interp::HostFunc,wabt::interp::Store&,wabt::interp::FuncType&,std::function<wabt::Result(std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>const&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>&,wabt::interp::RefPtr<wabt::interp::Trap>*)>&>
                      (&local_398,&s_store,&s_store,&local_2d0,
                       (function<wabt::Result_(const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*)>
                        *)&local_368);
            pIVar9 = (pointer)local_3f0._80_8_;
            if (local_358 != (code *)0x0) {
              (*local_358)(&local_368,&local_368,__destroy_functor);
            }
            local_3f0._16_8_ = &PTR__FuncType_001a01d0;
            if ((pointer)local_3f0._56_8_ != (pointer)0x0) {
              operator_delete((void *)local_3f0._56_8_);
            }
            if ((pointer)local_3f0._32_8_ != (pointer)0x0) {
              operator_delete((void *)local_3f0._32_8_);
            }
            if (pSStack_400 != (Store *)local_3f0) {
              operator_delete(pSStack_400);
            }
            local_2d0.super_ExternType._vptr_ExternType = (_func_int **)&PTR__FuncType_001a01d0;
            if (local_2d0.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_2d0.results.
                              super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                              super__Vector_impl_data._M_start);
            }
            if (local_2d0.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl
                .super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_2d0.params.
                              super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                              super__Vector_impl_data._M_start);
            }
            pRVar7 = (Ref *)&wabt::interp::Ref::Null;
            if (local_398.store_ != (Store *)0x0) {
              pRVar7 = wabt::interp::FreeList<wabt::interp::Ref>::Get
                                 (&(local_398.store_)->roots_,local_398.root_index_);
            }
            local_408 = (undefined1  [8])pRVar7->index;
            if (local_438.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_438.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::
              _M_realloc_insert<wabt::interp::Ref>
                        (&local_438,
                         (iterator)
                         local_438.
                         super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(Ref *)local_408);
            }
            else {
              (local_438.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
               _M_impl.super__Vector_impl_data._M_finish)->index = (size_t)local_408;
              local_438.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   local_438.
                   super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl
                   .super__Vector_impl_data._M_finish + 1;
            }
            if (local_398.obj_ != (HostFunc *)0x0) {
              wabt::interp::Store::DeleteRoot(local_398.store_,local_398.root_index_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
              operator_delete(local_2f0._M_dataplus._M_p);
            }
            local_348._0_8_ = &PTR__FuncType_001a01d0;
            if (local_320.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_320.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            if ((_Bit_pointer)local_348._16_8_ != (_Bit_pointer)0x0) {
              operator_delete((void *)local_348._16_8_);
            }
          }
          else {
LAB_00141598:
            if (local_438.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_438.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>>::
              _M_realloc_insert<wabt::interp::Ref_const&>
                        ((vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>> *)&local_438,
                         (iterator)
                         local_438.
                         super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(Ref *)&wabt::interp::Ref::Null);
            }
            else {
              (local_438.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
               _M_impl.super__Vector_impl_data._M_finish)->index = 0;
              local_438.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   local_438.
                   super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl
                   .super__Vector_impl_data._M_finish + 1;
            }
          }
          puVar2 = (unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
                    *)(psVar11 + 1);
          psVar11 = (string *)((long)(psVar11 + 2) + 8);
        } while ((pointer)(puVar2 + 1) != pIVar9);
      }
      local_408 = (undefined1  [8])0x0;
      pSStack_400 = (Store *)0x0;
      local_3f8 = 0;
      if (local_380.store_ == (Store *)0x0) {
        pRVar7 = (Ref *)&wabt::interp::Ref::Null;
      }
      else {
        pRVar7 = wabt::interp::FreeList<wabt::interp::Ref>::Get
                           (&(local_380.store_)->roots_,local_380.root_index_);
      }
      pPVar3 = local_410;
      wabt::interp::Instance::Instantiate
                ((Ptr *)local_348,&s_store,(Ref)pRVar7->index,&local_438,(Ptr *)local_408);
      pPVar3->obj_ = (Instance *)local_348._0_8_;
      pPVar3->store_ = (Store *)CONCAT44(local_348._12_4_,local_348._8_4_);
      pPVar3->root_index_ = local_348._16_8_;
      bVar12 = (Instance *)local_348._0_8_ == (Instance *)0x0;
      if (bVar12) {
        wabt::interp::WriteTrap
                  ((Stream *)
                   local_418.
                   super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>
                   .super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl,
                   "error initialiazing module",(Ptr *)local_408);
      }
      EVar10 = (Enum)bVar12;
      if (local_408 != (undefined1  [8])0x0) {
        wabt::interp::Store::DeleteRoot(pSStack_400,local_3f8);
      }
      if (local_438.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_438.
                        super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_380.obj_ != (Module *)0x0) {
        wabt::interp::Store::DeleteRoot(local_380.store_,local_380.root_index_);
      }
    }
    wabt::interp::ModuleDesc::~ModuleDesc(&local_290);
  }
  if (local_308 != (void *)0x0) {
    operator_delete(local_308);
  }
  return (Result)EVar10;
}

Assistant:

Result ReadAndInstantiateModule(const char* module_filename,
                                Errors* errors,
                                Instance::Ptr* out_instance) {
  auto* stream = s_stdout_stream.get();
  std::vector<uint8_t> file_data;
  CHECK_RESULT(ReadFile(module_filename, &file_data));

  ModuleDesc module_desc;
  const bool kReadDebugNames = true;
  const bool kStopOnFirstError = true;
  const bool kFailOnCustomSectionError = true;
  ReadBinaryOptions options(s_features, s_log_stream.get(), kReadDebugNames,
                            kStopOnFirstError, kFailOnCustomSectionError);
  CHECK_RESULT(ReadBinaryInterp(file_data.data(), file_data.size(), options,
                                errors, &module_desc));

  if (s_verbose) {
    module_desc.istream.Disassemble(stream);
  }

  auto module = Module::New(s_store, module_desc);

  RefVec imports;
  for (auto&& import : module_desc.imports) {
    if (import.type.type->kind == ExternKind::Func &&
        ((s_host_print && import.type.module == "host" &&
          import.type.name == "print") ||
         s_dummy_import_func)) {
      auto func_type = *cast<FuncType>(import.type.type.get());
      auto import_name = StringPrintf("%s.%s", import.type.module.c_str(),
                                      import.type.name.c_str());

      auto host_func =
          HostFunc::New(s_store, func_type,
                        [=](const Values& params, Values& results,
                            Trap::Ptr* trap) -> Result {
                          printf("called host ");
                          WriteCall(stream, import_name, func_type, params,
                                    results, *trap);
                          return Result::Ok;
                        });
      imports.push_back(host_func.ref());
      continue;
    }

    // By default, just push an null reference. This won't resolve, and
    // instantiation will fail.
    imports.push_back(Ref::Null);
  }

  RefPtr<Trap> trap;
  *out_instance = Instance::Instantiate(s_store, module.ref(), imports, &trap);
  if (!*out_instance) {
    // TODO: change to "initializing"
    WriteTrap(stream, "error initialiazing module", trap);
    return Result::Error;
  }

  return Result::Ok;
}